

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setAlternateHandling
          (CollationSettings *this,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t noAlternate;
  UErrorCode *errorCode_local;
  int32_t defaultOptions_local;
  UColAttributeValue value_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uVar2 = this->options & 0xfffffff3;
    if (value == UCOL_DEFAULT) {
      this->options = uVar2 | defaultOptions & 0xcU;
    }
    else if (value == UCOL_SHIFTED) {
      this->options = uVar2 | 4;
    }
    else if (value == UCOL_NON_IGNORABLE) {
      this->options = uVar2;
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void
CollationSettings::setAlternateHandling(UColAttributeValue value,
                                        int32_t defaultOptions, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t noAlternate = options & ~ALTERNATE_MASK;
    switch(value) {
    case UCOL_NON_IGNORABLE:
        options = noAlternate;
        break;
    case UCOL_SHIFTED:
        options = noAlternate | SHIFTED;
        break;
    case UCOL_DEFAULT:
        options = noAlternate | (defaultOptions & ALTERNATE_MASK);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
}